

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

bool __thiscall reflection::Field::Verify(Field *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  long lVar3;
  unsigned_short vtsize;
  ushort uVar4;
  String *str;
  Field *pFVar5;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_00;
  Type *this_00;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if (*(ushort *)(this + -(long)*(int *)this) < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(this + (4 - (long)*(int *)this));
    }
    if (uVar2 == 0) {
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      if (*(ushort *)(this + -(long)*(int *)this) < 7) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (6 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        this_00 = (Type *)0x0;
      }
      else {
        this_00 = (Type *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
      }
      if (((((this_00 == (Type *)0x0) || (bVar1 = Type::Verify(this_00,verifier), bVar1)) &&
           (bVar1 = flatbuffers::Table::VerifyField<unsigned_short>(&this->super_Table,verifier,8,2)
           , bVar1)) &&
          ((bVar1 = flatbuffers::Table::VerifyField<unsigned_short>
                              (&this->super_Table,verifier,10,2), bVar1 &&
           (bVar1 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,0xc,8), bVar1)
           ))) && (bVar1 = flatbuffers::Table::VerifyField<double>
                                     (&this->super_Table,verifier,0xe,8), bVar1)) {
        lVar3 = -(long)*(int *)this;
        uVar2 = *(ushort *)(this + -(long)*(int *)this);
        if (uVar2 < 0x11) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ushort *)(this + lVar3 + 0x10);
        }
        if (uVar4 != 0) {
          if (verifier->size_ < 2) {
            return false;
          }
          if ((Field *)(verifier->size_ - 1) < this + ((ulong)uVar4 - (long)verifier->buf_)) {
            return false;
          }
        }
        if (uVar2 < 0x13) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ushort *)(this + lVar3 + 0x12);
        }
        if (uVar4 != 0) {
          if (verifier->size_ < 2) {
            return false;
          }
          if ((Field *)(verifier->size_ - 1) < this + ((ulong)uVar4 - (long)verifier->buf_)) {
            return false;
          }
        }
        if (uVar2 < 0x15) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(ushort *)(this + lVar3 + 0x14);
        }
        if (uVar2 != 0) {
          if (verifier->size_ < 2) {
            return false;
          }
          if ((Field *)(verifier->size_ - 1) < this + ((ulong)uVar2 - (long)verifier->buf_)) {
            return false;
          }
        }
        bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0x16);
        if (bVar1) {
          if (*(ushort *)(this + -(long)*(int *)this) < 0x17) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (0x16 - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            pFVar5 = (Field *)0x0;
          }
          else {
            pFVar5 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
          }
          if ((pFVar5 != (Field *)0x0) &&
             (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (verifier,(uint8_t *)pFVar5,4,(size_t *)0x0), !bVar1)) {
            return false;
          }
          if (*(ushort *)(this + -(long)*(int *)this) < 0x17) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (0x16 - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            vec = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
          }
          else {
            vec = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                  (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
          }
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                            (verifier,vec);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0x18), bVar1)) {
            if (*(ushort *)(this + -(long)*(int *)this) < 0x19) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0x18 - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              pFVar5 = (Field *)0x0;
            }
            else {
              pFVar5 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
            }
            if ((pFVar5 != (Field *)0x0) &&
               (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                  (verifier,(uint8_t *)pFVar5,4,(size_t *)0x0), !bVar1)) {
              return false;
            }
            if (*(ushort *)(this + -(long)*(int *)this) < 0x19) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0x18 - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              vec_00 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
            }
            else {
              vec_00 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                       (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec_00);
            if (bVar1) {
              if (*(ushort *)(this + -(long)*(int *)this) < 0x1b) {
                uVar2 = 0;
              }
              else {
                uVar2 = *(ushort *)(this + (0x1a - (long)*(int *)this));
              }
              if (uVar2 != 0) {
                if (verifier->size_ < 2) {
                  return false;
                }
                if ((Field *)(verifier->size_ - 1) < this + ((ulong)uVar2 - (long)verifier->buf_)) {
                  return false;
                }
              }
              bVar1 = flatbuffers::Table::VerifyField<unsigned_short>
                                (&this->super_Table,verifier,0x1c,2);
              if (bVar1) {
                if (*(ushort *)(this + -(long)*(int *)this) < 0x1f) {
                  uVar2 = 0;
                }
                else {
                  uVar2 = *(ushort *)(this + (0x1e - (long)*(int *)this));
                }
                if (uVar2 != 0) {
                  if (verifier->size_ < 2) {
                    return false;
                  }
                  if ((Field *)(verifier->size_ - 1) < this + ((ulong)uVar2 - (long)verifier->buf_))
                  {
                    return false;
                  }
                }
                verifier->depth_ = verifier->depth_ - 1;
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_TYPE) &&
           verifier.VerifyTable(type()) &&
           VerifyField<uint16_t>(verifier, VT_ID, 2) &&
           VerifyField<uint16_t>(verifier, VT_OFFSET, 2) &&
           VerifyField<int64_t>(verifier, VT_DEFAULT_INTEGER, 8) &&
           VerifyField<double>(verifier, VT_DEFAULT_REAL, 8) &&
           VerifyField<uint8_t>(verifier, VT_DEPRECATED, 1) &&
           VerifyField<uint8_t>(verifier, VT_REQUIRED, 1) &&
           VerifyField<uint8_t>(verifier, VT_KEY, 1) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyField<uint8_t>(verifier, VT_OPTIONAL, 1) &&
           VerifyField<uint16_t>(verifier, VT_PADDING, 2) &&
           VerifyField<uint8_t>(verifier, VT_OFFSET64, 1) &&
           verifier.EndTable();
  }